

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynNamespaceElement * __thiscall ParseContext::PushNamespace(ParseContext *this,SynIdentifier *name)

{
  SmallArray<SynNamespaceElement_*,_32U> *this_00;
  uint uVar1;
  SynNamespaceElement *parent;
  SynNamespaceElement *pSVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  bool bVar7;
  SynNamespaceElement *local_48;
  
  parent = this->currentNamespace;
  this_00 = &this->namespaceList;
  bVar7 = (this->namespaceList).count != 0;
  if (bVar7) {
    uVar6 = 0;
    do {
      pSVar2 = this_00->data[uVar6];
      bVar3 = true;
      if ((pSVar2->parent == parent) &&
         (bVar4 = InplaceStr::operator==(&pSVar2->name->name,&name->name), bVar4)) {
        this->currentNamespace = pSVar2;
        bVar3 = false;
        local_48 = pSVar2;
      }
      if (!bVar3) break;
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < (this->namespaceList).count;
    } while (bVar7);
  }
  if (!bVar7) {
    iVar5 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
    local_48 = (SynNamespaceElement *)CONCAT44(extraout_var,iVar5);
    SynNamespaceElement::SynNamespaceElement(local_48,parent,name);
    uVar1 = (this->namespaceList).count;
    if (uVar1 == (this->namespaceList).max) {
      SmallArray<SynNamespaceElement_*,_32U>::grow(this_00,uVar1);
    }
    if (this_00->data == (SynNamespaceElement **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<SynNamespaceElement *, 32>::push_back(const T &) [T = SynNamespaceElement *, N = 32]"
                   );
    }
    uVar1 = (this->namespaceList).count;
    (this->namespaceList).count = uVar1 + 1;
    this_00->data[uVar1] = local_48;
    this->currentNamespace = local_48;
  }
  return local_48;
}

Assistant:

SynNamespaceElement* ParseContext::PushNamespace(SynIdentifier *name)
{
	SynNamespaceElement *current = currentNamespace;

	// Search for existing namespace in the same context
	for(unsigned i = 0; i < namespaceList.size(); i++)
	{
		SynNamespaceElement *ns = namespaceList[i];

		if(ns->parent == current && ns->name->name == name->name)
		{
			currentNamespace = ns;
			return ns;
		}
	}

	// Create new namespace
	SynNamespaceElement *ns = new (get<SynNamespaceElement>()) SynNamespaceElement(current, name);
	namespaceList.push_back(ns);

	currentNamespace = ns;
	return ns;
}